

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Location *__return_storage_ptr__;
  Module *this_00;
  undefined1 local_98 [8];
  Var start;
  _Head_base<0UL,_wabt::StartModuleField_*,_false> local_30;
  
  if ((ulong)func_index <
      (ulong)((long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    __return_storage_ptr__ = (Location *)((long)&start.field_2 + 0x18);
    GetLocation(__return_storage_ptr__,this);
    Var::Var((Var *)local_98,func_index,__return_storage_ptr__);
    this_00 = this->module_;
    GetLocation(__return_storage_ptr__,this);
    MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location>
              ((wabt *)&local_30,(Var *)local_98,__return_storage_ptr__);
    Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                 *)&local_30);
    if (local_30._M_head_impl != (StartModuleField *)0x0) {
      (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_30._M_head_impl = (StartModuleField *)0x0;
    Var::~Var((Var *)local_98);
    return (Result)Ok;
  }
  __assert_fail("func_index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x236,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnStartFunction(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  assert(func_index < module_->funcs.size());
  Var start(func_index, GetLocation());
  module_->AppendField(MakeUnique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}